

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::FeatureType::set_allocated_int64type
          (FeatureType *this,Int64FeatureType *int64type)

{
  Arena *message_arena_00;
  Arena *submessage_arena_00;
  Arena *submessage_arena;
  Arena *message_arena;
  Int64FeatureType *int64type_local;
  FeatureType *this_local;
  
  message_arena_00 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
  clear_Type(this);
  if (int64type != (Int64FeatureType *)0x0) {
    submessage_arena_00 =
         google::protobuf::Arena::InternalHelper<CoreML::Specification::Int64FeatureType>::
         GetOwningArena(int64type);
    message_arena = (Arena *)int64type;
    if (message_arena_00 != submessage_arena_00) {
      message_arena =
           (Arena *)google::protobuf::internal::
                    GetOwnedMessage<CoreML::Specification::Int64FeatureType>
                              (message_arena_00,int64type,submessage_arena_00);
    }
    set_has_int64type(this);
    (this->Type_).int64type_ = (Int64FeatureType *)message_arena;
  }
  return;
}

Assistant:

void FeatureType::set_allocated_int64type(::CoreML::Specification::Int64FeatureType* int64type) {
  ::PROTOBUF_NAMESPACE_ID::Arena* message_arena = GetArenaForAllocation();
  clear_Type();
  if (int64type) {
    ::PROTOBUF_NAMESPACE_ID::Arena* submessage_arena =
      ::PROTOBUF_NAMESPACE_ID::Arena::InternalHelper<::CoreML::Specification::Int64FeatureType>::GetOwningArena(int64type);
    if (message_arena != submessage_arena) {
      int64type = ::PROTOBUF_NAMESPACE_ID::internal::GetOwnedMessage(
          message_arena, int64type, submessage_arena);
    }
    set_has_int64type();
    Type_.int64type_ = int64type;
  }
  // @@protoc_insertion_point(field_set_allocated:CoreML.Specification.FeatureType.int64Type)
}